

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  byte bVar2;
  Vdbe *p;
  ExprList *pEVar3;
  Expr *pEVar4;
  Parse *pPVar5;
  u8 uVar6;
  int iVar7;
  undefined4 extraout_var;
  KeyInfo *pKVar8;
  Select *pSVar9;
  Expr *pLeft;
  CollSeq *pCVar10;
  int iVar11;
  Select *pSVar12;
  Op *pOVar13;
  uint uVar14;
  ExprList_item *pEVar15;
  ulong uVar16;
  ExprList **ppEVar17;
  int iVar18;
  bool bVar19;
  char affinity;
  char local_9d;
  int local_9c;
  Parse *local_98;
  int local_8c;
  undefined8 local_88;
  KeyInfo *local_80;
  uint local_74;
  Expr *local_70;
  Walker local_68;
  Expr *local_38;
  
  p = pParse->pVdbe;
  uVar14 = pExpr->flags;
  local_88 = 0;
  local_9c = iTab;
  if (((uVar14 & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((uVar14 >> 0x19 & 1) != 0) {
      iVar11 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
      if ((pExpr->flags & 0x1000) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp3(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,0);
      sqlite3VdbeAddOp3(p,0x73,local_9c,pExpr->iTable,0);
      if (p->db->mallocFailed == '\0') {
        pOVar13 = p->aOp + iVar11;
      }
      else {
        pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar13->p2 = p->nOp;
      return;
    }
    pExpr->flags = uVar14 | 0x2000000;
    iVar11 = pParse->nMem + 1;
    pParse->nMem = iVar11;
    (pExpr->y).sub.regReturn = iVar11;
    iVar11 = sqlite3VdbeAddOp3(p,0x4a,0,iVar11,0);
    (pExpr->y).sub.iAddr = iVar11 + 1;
    iVar11 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
    local_88 = CONCAT44(extraout_var,iVar11);
  }
  pSVar9 = (Select *)pExpr->pLeft;
  uVar6 = pSVar9->op;
  if (uVar6 == 0xb0) {
    uVar6 = *(u8 *)&pSVar9->nSelectRow;
  }
  pSVar12 = pSVar9;
  if (uVar6 == 0xb1) {
LAB_0018ae13:
    uVar14 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr;
  }
  else {
    uVar14 = 1;
    if (uVar6 == 0x8a) {
      pSVar12 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar9->pEList)->pSelect;
      goto LAB_0018ae13;
    }
  }
  pExpr->iTable = local_9c;
  local_8c = sqlite3VdbeAddOp3(p,0x76,local_9c,uVar14,0);
  pKVar8 = sqlite3KeyInfoAlloc(pParse->db,uVar14,1);
  pSVar12 = (Select *)(pExpr->x).pList;
  local_80 = pKVar8;
  if ((pExpr->flags & 0x1000) != 0) {
    pEVar3 = pSVar12->pEList;
    bVar19 = false;
    local_70 = pExpr;
    local_38 = (Expr *)pSVar9;
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d");
    pKVar8 = local_80;
    pExpr = local_70;
    local_74 = uVar14;
    if (pEVar3->nExpr == uVar14) {
      local_68.pParse._0_1_ = 0xb;
      local_68.pParse._4_4_ = local_9c;
      local_68.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)0x0;
      local_68.xSelectCallback =
           (_func_int_Walker_ptr_Select_ptr *)((ulong)local_68.xSelectCallback & 0xffffffff00000000)
      ;
      local_68.xSelectCallback2 =
           (_func_void_Walker_ptr_Select_ptr *)exprINAffinity(pParse,local_70);
      pSVar12->iLimit = 0;
      pSVar9 = sqlite3SelectDup(pParse->db,pSVar12,0);
      local_98 = pParse;
      if (pParse->db->mallocFailed == '\0') {
        iVar11 = sqlite3Select(pParse,pSVar9,(SelectDest *)&local_68);
        bVar19 = iVar11 == 0;
      }
      uVar14 = local_74;
      if (pSVar9 != (Select *)0x0) {
        clearSelect(local_98->db,pSVar9,1);
      }
      if (local_68.xSelectCallback2 != (_func_void_Walker_ptr_Select_ptr *)0x0) {
        sqlite3DbFreeNN(local_98->db,local_68.xSelectCallback2);
      }
      pEVar4 = local_38;
      pKVar8 = local_80;
      if (!bVar19) {
        if (local_80 == (KeyInfo *)0x0) {
          return;
        }
        local_80->nRef = local_80->nRef - 1;
        if (local_80->nRef != 0) {
          return;
        }
        sqlite3DbNNFreeNN(local_80->db,local_80);
        return;
      }
      pParse = local_98;
      pExpr = local_70;
      if (0 < (int)uVar14) {
        pEVar15 = pEVar3->a;
        uVar16 = 0;
        do {
          pLeft = sqlite3VectorFieldSubexpr(pEVar4,(int)uVar16);
          pCVar10 = sqlite3BinaryCompareCollSeq(local_98,pLeft,pEVar15->pExpr);
          pKVar8->aColl[uVar16] = pCVar10;
          uVar16 = uVar16 + 1;
          pEVar15 = pEVar15 + 1;
          pParse = local_98;
          pExpr = local_70;
        } while (uVar14 != uVar16);
      }
    }
    goto LAB_0018b20d;
  }
  local_98 = pParse;
  if (pSVar12 == (Select *)0x0) goto LAB_0018b20d;
  local_9d = sqlite3ExprAffinity((Expr *)pSVar9);
  pKVar8 = local_80;
  pPVar5 = local_98;
  if (local_9d < 'A') {
    local_9d = 'A';
  }
  else if (local_9d == 'E') {
    local_9d = 'C';
  }
  if (local_80 != (KeyInfo *)0x0) {
    pCVar10 = sqlite3ExprCollSeq(local_98,pExpr->pLeft);
    pKVar8->aColl[0] = pCVar10;
  }
  uVar6 = pPVar5->nTempReg;
  if (uVar6 == '\0') {
    iVar11 = pPVar5->nMem + 1;
    pPVar5->nMem = iVar11;
LAB_0018b08d:
    uVar14 = pPVar5->nMem + 1;
    pPVar5->nMem = uVar14;
  }
  else {
    bVar2 = uVar6 - 1;
    pPVar5->nTempReg = bVar2;
    iVar11 = pPVar5->aTempReg[bVar2];
    if (bVar2 == 0) goto LAB_0018b08d;
    pPVar5->nTempReg = uVar6 - 2;
    uVar14 = pPVar5->aTempReg[(byte)(uVar6 - 2)];
  }
  local_70 = pExpr;
  if (0 < *(int *)pSVar12) {
    ppEVar17 = (ExprList **)&pSVar12->iLimit;
    iVar18 = *(int *)pSVar12 + 1;
    local_74 = uVar14;
    do {
      pEVar4 = (Expr *)*ppEVar17;
      if ((int)local_88 == 0) {
LAB_0018b12a:
        local_88 = 0;
      }
      else {
        local_68.eCode = 1;
        local_68.xExprCallback = exprNodeIsConstant;
        local_68.xSelectCallback = sqlite3SelectWalkFail;
        local_68.u.n = 0;
        if ((pEVar4 != (Expr *)0x0) && (walkExpr(&local_68,pEVar4), local_68.eCode == 0)) {
          iVar7 = (int)local_88;
          sqlite3VdbeChangeToNoop(p,iVar7 + -1);
          uVar14 = local_74;
          sqlite3VdbeChangeToNoop(p,iVar7);
          pbVar1 = (byte *)((long)&local_70->flags + 3);
          *pbVar1 = *pbVar1 & 0xfd;
          goto LAB_0018b12a;
        }
      }
      sqlite3ExprCode(local_98,pEVar4,iVar11);
      iVar7 = sqlite3VdbeAddOp3(p,0x61,iVar11,1,uVar14);
      sqlite3VdbeChangeP4(p,iVar7,&local_9d,1);
      iVar7 = sqlite3VdbeAddOp3(p,0x8a,local_9c,uVar14,iVar11);
      if (p->db->mallocFailed == '\0') {
        pOVar13 = p->aOp;
        pOVar13[iVar7].p4type = -3;
        pOVar13[iVar7].p4.i = 1;
      }
      ppEVar17 = ppEVar17 + 3;
      iVar18 = iVar18 + -1;
    } while (1 < iVar18);
  }
  if (iVar11 != 0) {
    bVar2 = local_98->nTempReg;
    if ((ulong)bVar2 < 8) {
      local_98->nTempReg = bVar2 + 1;
      local_98->aTempReg[bVar2] = iVar11;
    }
  }
  pKVar8 = local_80;
  pParse = local_98;
  pExpr = local_70;
  if (uVar14 != 0) {
    bVar2 = local_98->nTempReg;
    if ((ulong)bVar2 < 8) {
      local_98->nTempReg = bVar2 + 1;
      local_98->aTempReg[bVar2] = uVar14;
    }
  }
LAB_0018b20d:
  if (pKVar8 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p,local_8c,(char *)pKVar8,-8);
  }
  if ((int)local_88 != 0) {
    sqlite3VdbeAddOp3(p,0x88,local_9c,0,0);
    if (p->db->mallocFailed == '\0') {
      pOVar13 = p->aOp + (int)local_88;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
    pParse->nTempReg = '\0';
    pParse->nRangeReg = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed */
    /* If this routine has already been coded, but the previous code
    ** might not have been invoked yet, so invoke it now as a subroutine.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}